

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  CppType CVar1;
  int iVar2;
  LogMessage *pLVar3;
  undefined4 extraout_var;
  string *local_c8;
  MessageLite *ret;
  LogMessage local_b8;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  Extension *local_30;
  Extension *extension;
  MessageLite *prototype_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)prototype;
  prototype_local._4_4_ = number;
  pEStack_18 = this;
  local_30 = FindOrNull(this,number);
  if (local_30 == (Extension *)0x0) {
    this_local = (ExtensionSet *)0x0;
  }
  else {
    local_69 = 0;
    if ((local_30->is_repeated & 1U) != 0) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x30e);
      local_69 = 1;
      pLVar3 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(local_7d,pLVar3);
    }
    if ((local_69 & 1) != 0) {
      LogMessage::~LogMessage(&local_68);
    }
    CVar1 = anon_unknown_22::cpp_type(local_30->type);
    ret._7_1_ = 0;
    if (CVar1 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x30e);
      ret._7_1_ = 1;
      pLVar3 = LogMessage::operator<<
                         (&local_b8,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)((long)&ret + 6),pLVar3);
    }
    if ((ret._7_1_ & 1) != 0) {
      LogMessage::~LogMessage(&local_b8);
    }
    if (((byte)local_30->field_0xa >> 4 & 1) == 0) {
      local_c8 = (local_30->field_0).string_value;
    }
    else {
      iVar2 = (*((local_30->field_0).message_value)->_vptr_MessageLite[8])
                        ((local_30->field_0).message_value,extension,this->arena_);
      local_c8 = (string *)CONCAT44(extraout_var,iVar2);
      if ((this->arena_ == (Arena *)0x0) &&
         ((local_30->field_0).message_value != (MessageLite *)0x0)) {
        (*((local_30->field_0).message_value)->_vptr_MessageLite[1])();
      }
    }
    Erase(this,prototype_local._4_4_);
    this_local = (ExtensionSet *)local_c8;
  }
  return (MessageLite *)this_local;
}

Assistant:

MessageLite* ExtensionSet::UnsafeArenaReleaseMessage(
    int number, const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      ret = extension->lazymessage_value->UnsafeArenaReleaseMessage(prototype,
                                                                    arena_);
      if (arena_ == nullptr) {
        delete extension->lazymessage_value;
      }
    } else {
      ret = extension->message_value;
    }
    Erase(number);
    return ret;
  }
}